

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.h
# Opt level: O1

Literal_t * Lit_Alloc(uint *pTruth,int nVars,int varIdx,char pol)

{
  uint uVar1;
  int iVar2;
  uint *__ptr;
  uint *puVar3;
  uint *pOut;
  uint *__ptr_00;
  long lVar4;
  Vec_Str_t *pVVar5;
  char *pcVar6;
  Literal_t *pLVar7;
  undefined7 in_register_00000009;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  uint *ncof1;
  size_t sVar11;
  uint *cof1;
  
  iVar2 = (int)CONCAT71(in_register_00000009,pol);
  if ((iVar2 != 0x2b) && (iVar2 != 0x2d)) {
    __assert_fail("pol == \'+\' || pol == \'-\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/rpo/literal.h"
                  ,0x88,"Literal_t *Lit_Alloc(unsigned int *, int, int, char)");
  }
  uVar9 = 1 << ((char)nVars - 5U & 0x1f);
  if (nVars < 6) {
    uVar9 = 1;
  }
  sVar11 = (long)(int)uVar9 << 2;
  __ptr = (uint *)malloc(sVar11);
  puVar3 = (uint *)malloc(sVar11);
  pOut = (uint *)malloc(sVar11);
  Kit_TruthCofactor0New(puVar3,pTruth,nVars,varIdx);
  Kit_TruthCofactor1New(pOut,pTruth,nVars,varIdx);
  __ptr_00 = (uint *)malloc(sVar11);
  uVar10 = (ulong)uVar9;
  if (pol == '+') {
    if (0 < (int)uVar9) {
      lVar4 = uVar10 + 1;
      do {
        __ptr_00[lVar4 + -2] = ~puVar3[lVar4 + -2];
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
      lVar4 = uVar10 + 1;
      do {
        __ptr[lVar4 + -2] = pOut[lVar4 + -2] & __ptr_00[lVar4 + -2];
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    if (puVar3 != (uint *)0x0) {
      free(puVar3);
    }
    puVar3 = pOut;
    if (__ptr_00 != (uint *)0x0) {
      free(__ptr_00);
    }
  }
  else {
    if (0 < (int)uVar9) {
      lVar4 = uVar10 + 1;
      do {
        __ptr_00[lVar4 + -2] = ~pOut[lVar4 + -2];
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
      lVar4 = uVar10 + 1;
      do {
        __ptr[lVar4 + -2] = puVar3[lVar4 + -2] & __ptr_00[lVar4 + -2];
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    if (puVar3 != (uint *)0x0) {
      free(puVar3);
    }
    puVar3 = __ptr_00;
    if (pOut != (uint *)0x0) {
      free(pOut);
    }
  }
  uVar8 = uVar10;
  if (puVar3 != (uint *)0x0) {
    free(puVar3);
  }
  do {
    iVar2 = (int)uVar8;
    if (iVar2 < 1) goto LAB_005e033f;
    lVar4 = uVar8 - 1;
    uVar8 = uVar8 - 1;
  } while (__ptr[lVar4] == 0);
  if (iVar2 < 1) {
LAB_005e033f:
    if (__ptr != (uint *)0x0) {
      free(__ptr);
    }
    return (Literal_t *)0x0;
  }
  puVar3 = (uint *)malloc(sVar11);
  if (varIdx < 5) {
    if (0 < (int)uVar9) {
      uVar1 = *(uint *)(&DAT_009f88c0 + (ulong)(uint)varIdx * 4);
      uVar8 = 0;
      do {
        puVar3[uVar8] = uVar1;
        uVar8 = uVar8 + 1;
      } while (uVar10 != uVar8);
    }
  }
  else if (0 < (int)uVar9) {
    uVar8 = 0;
    do {
      puVar3[uVar8] = -(uint)((1 << ((char)varIdx - 5U & 0x1f) & (uint)uVar8) != 0);
      uVar8 = uVar8 + 1;
    } while (uVar10 != uVar8);
  }
  pVVar5 = (Vec_Str_t *)malloc(0x10);
  pVVar5->nCap = 0x10;
  pVVar5->nSize = 0;
  pcVar6 = (char *)malloc(0x10);
  pVVar5->pArray = pcVar6;
  if (pol == '-') {
    if (0 < (int)uVar9) {
      lVar4 = uVar10 + 1;
      do {
        puVar3[lVar4 + -2] = ~puVar3[lVar4 + -2];
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    pVVar5->nSize = 1;
    *pVVar5->pArray = '!';
  }
  uVar9 = pVVar5->nCap;
  if (pVVar5->nSize == uVar9) {
    if ((int)uVar9 < 0x10) {
      if (pVVar5->pArray == (char *)0x0) {
        pcVar6 = (char *)malloc(0x10);
      }
      else {
        pcVar6 = (char *)realloc(pVVar5->pArray,0x10);
      }
      sVar11 = 0x10;
    }
    else {
      sVar11 = (ulong)uVar9 * 2;
      if ((int)sVar11 <= (int)uVar9) goto LAB_005e043f;
      if (pVVar5->pArray == (char *)0x0) {
        pcVar6 = (char *)malloc(sVar11);
      }
      else {
        pcVar6 = (char *)realloc(pVVar5->pArray,sVar11);
      }
    }
    pVVar5->pArray = pcVar6;
    pVVar5->nCap = (int)sVar11;
  }
LAB_005e043f:
  iVar2 = pVVar5->nSize;
  pVVar5->nSize = iVar2 + 1;
  pVVar5->pArray[iVar2] = (char)varIdx + 'a';
  uVar9 = pVVar5->nCap;
  if (pVVar5->nSize == uVar9) {
    if ((int)uVar9 < 0x10) {
      if (pVVar5->pArray == (char *)0x0) {
        pcVar6 = (char *)malloc(0x10);
      }
      else {
        pcVar6 = (char *)realloc(pVVar5->pArray,0x10);
      }
      sVar11 = 0x10;
    }
    else {
      sVar11 = (ulong)uVar9 * 2;
      if ((int)sVar11 <= (int)uVar9) goto LAB_005e04b7;
      if (pVVar5->pArray == (char *)0x0) {
        pcVar6 = (char *)malloc(sVar11);
      }
      else {
        pcVar6 = (char *)realloc(pVVar5->pArray,sVar11);
      }
    }
    pVVar5->pArray = pcVar6;
    pVVar5->nCap = (int)sVar11;
  }
LAB_005e04b7:
  iVar2 = pVVar5->nSize;
  pVVar5->nSize = iVar2 + 1;
  pVVar5->pArray[iVar2] = '\0';
  pLVar7 = (Literal_t *)malloc(0x18);
  pLVar7->function = puVar3;
  pLVar7->transition = __ptr;
  pLVar7->expression = pVVar5;
  return pLVar7;
}

Assistant:

static inline Literal_t* Lit_Alloc(unsigned* pTruth, int nVars, int varIdx, char pol) {
    unsigned * transition;
    unsigned * function;
    Vec_Str_t * exp;
    Literal_t* lit;
    assert(pol == '+' || pol == '-');
    transition = ABC_ALLOC(unsigned, Kit_TruthWordNum(nVars));
    if (pol == '+') {
        Lit_TruthPositiveTransition(pTruth, transition, nVars, varIdx);
    } else {
        Lit_TruthNegativeTransition(pTruth, transition, nVars, varIdx);
    }
    if (!Kit_TruthIsConst0(transition,nVars)) {
        function = ABC_ALLOC(unsigned, Kit_TruthWordNum(nVars));
        Kit_TruthIthVar(function, nVars, varIdx);
        //Abc_Print(-2, "Allocating function %X %d %c \n", *function, varIdx, pol);
        exp = Vec_StrAlloc(5);
        if (pol == '-') {
            Kit_TruthNot(function, function, nVars);
            Vec_StrPutC(exp, '!');
        }
        Vec_StrPutC(exp, (char)('a' + varIdx));
        Vec_StrPutC(exp, '\0');
        lit = ABC_ALLOC(Literal_t, 1);
        lit->function = function;
        lit->transition = transition;
        lit->expression = exp;
        return lit;
    } else {
        ABC_FREE(transition); // free the function.
        return NULL;
    }
}